

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

size_t check_for_missing<PredictionData<double,long>>
                 (PredictionData<double,_long> *prediction_data,Imputer *imputer,size_t *ix_arr,
                 int nthreads)

{
  int iVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  size_t row;
  ulong uVar6;
  size_t sVar7;
  ulong *puVar8;
  long lVar9;
  int *piVar10;
  size_t sVar11;
  vector<char,_std::allocator<char>_> has_missing;
  allocator_type local_3a;
  value_type_conflict5 local_39;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_39 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_38,prediction_data->nrows,&local_39,
             &local_3a);
  lVar4 = 0;
  lVar5 = 0;
  uVar6 = 0;
  do {
    sVar7 = prediction_data->nrows;
    if (sVar7 <= uVar6) {
      sVar11 = 0;
      for (uVar6 = 0; uVar6 < sVar7; uVar6 = uVar6 + 1) {
        if (local_38._M_impl.super__Vector_impl_data._M_start[uVar6] != '\0') {
          sVar7 = ix_arr[sVar11];
          ix_arr[sVar11] = ix_arr[uVar6];
          ix_arr[uVar6] = sVar7;
          sVar11 = sVar11 + 1;
          sVar7 = prediction_data->nrows;
        }
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
      return sVar11;
    }
    pdVar2 = prediction_data->numeric_data;
    if (pdVar2 == (double *)0x0) {
      if (prediction_data->Xr != (double *)0x0) {
        lVar9 = prediction_data->Xr_indptr[uVar6];
        do {
          if (prediction_data->Xr_indptr[uVar6 + 1] <= lVar9) goto LAB_001f48cc;
          pdVar2 = prediction_data->Xr + lVar9;
          lVar9 = lVar9 + 1;
        } while ((ulong)ABS(*pdVar2) < 0x7ff0000000000000);
        goto LAB_001f48c2;
      }
    }
    else {
      sVar11 = imputer->ncols_numeric;
      if (prediction_data->is_col_major == false) {
        sVar7 = 0;
        do {
          if (sVar11 == sVar7) goto LAB_001f48cc;
          lVar9 = sVar7 * 8;
          sVar7 = sVar7 + 1;
        } while ((*(ulong *)((long)pdVar2 + lVar9 + sVar11 * lVar5) & 0x7fffffffffffffff) <
                 0x7ff0000000000000);
      }
      else {
        lVar9 = sVar11 + 1;
        puVar8 = (ulong *)((long)pdVar2 + lVar5);
        do {
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_001f48cc;
          uVar3 = *puVar8;
          puVar8 = puVar8 + sVar7;
        } while ((uVar3 & 0x7fffffffffffffff) < 0x7ff0000000000000);
      }
LAB_001f48c2:
      local_38._M_impl.super__Vector_impl_data._M_start[uVar6] = '\x01';
    }
LAB_001f48cc:
    if (local_38._M_impl.super__Vector_impl_data._M_start[uVar6] == '\0') {
      sVar7 = imputer->ncols_categ;
      if (prediction_data->is_col_major == false) {
        sVar11 = 0;
        do {
          if (sVar7 == sVar11) goto LAB_001f4929;
          lVar9 = sVar11 * 4;
          sVar11 = sVar11 + 1;
        } while (-1 < *(int *)((long)prediction_data->categ_data + lVar9 + sVar7 * lVar4));
      }
      else {
        lVar9 = sVar7 + 1;
        piVar10 = (int *)((long)prediction_data->categ_data + lVar4);
        do {
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_001f4929;
          iVar1 = *piVar10;
          piVar10 = piVar10 + prediction_data->nrows;
        } while (-1 < iVar1);
      }
      local_38._M_impl.super__Vector_impl_data._M_start[uVar6] = '\x01';
    }
LAB_001f4929:
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 8;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

size_t check_for_missing(PredictionData  &prediction_data,
                         Imputer         &imputer,
                         size_t          ix_arr[],
                         int             nthreads)
{
    std::vector<char> has_missing(prediction_data.nrows, false);

    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(has_missing, prediction_data, imputer)
    for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
    {
        if (prediction_data.numeric_data != NULL)
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }

        else if (prediction_data.Xr != NULL)
        {
            for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            {
                if (is_na_or_inf(prediction_data.Xr[ix]))
                {
                    has_missing[row] = true;
                    break;
                }
            }
        }

        if (!has_missing[row])
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }
    }

    size_t st = 0;
    size_t temp;
    for (size_t row = 0; row < prediction_data.nrows; row++)
    {
        if (has_missing[row])
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }

    if (st == 0)
        return 0;

    return st;
}